

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mctools_path_join(mcu8str *__return_storage_ptr__,mcu8str *p1raw,mcu8str *p2raw)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  mcu8str *str;
  long lVar8;
  mcu8str_size_t prealloc_size;
  ulong uVar9;
  ulong uVar10;
  mcu8str p2;
  mcu8str p1;
  mcu8str local_68;
  mcu8str local_50;
  char *local_38;
  
  str = &local_68;
  pcVar2 = p1raw->c_str;
  uVar7 = p1raw->size;
  local_50.buflen = uVar7 + 1;
  local_50.owns_memory = 0;
  local_50.c_str = pcVar2;
  local_50.size = uVar7;
  iVar6 = mctools_impl_has_winnamespace(p1raw);
  if (iVar6 != 0) {
    local_50.c_str = pcVar2 + 4;
    local_50.size = uVar7 - 4;
  }
  pcVar2 = p2raw->c_str;
  uVar7 = p2raw->size;
  local_68.buflen = uVar7 + 1;
  local_68.owns_memory = 0;
  local_68.c_str = pcVar2;
  local_68.size = uVar7;
  iVar6 = mctools_impl_has_winnamespace(p2raw);
  if (iVar6 != 0) {
    local_68.c_str = pcVar2 + 4;
    local_68.size = uVar7 - 4;
  }
  uVar7 = local_68.size;
  uVar10 = (ulong)local_68.size;
  uVar9 = (ulong)local_50.size;
  if (uVar10 == 0) {
    if (uVar9 == 0) {
      __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
      __return_storage_ptr__->size = 0;
      __return_storage_ptr__->buflen = 0;
      __return_storage_ptr__->owns_memory = 0;
      return __return_storage_ptr__;
    }
    if ((local_50.c_str[local_50.size - 1] != '\\') && (local_50.c_str[local_50.size - 1] != '/')) {
      mcu8str_create(__return_storage_ptr__,(ulong)(local_50.size + 1));
      mcu8str_append(__return_storage_ptr__,&local_50);
      pcVar2 = __return_storage_ptr__->c_str;
      uVar7 = __return_storage_ptr__->size;
      pcVar2[uVar7] = '/';
      uVar7 = uVar7 + 1;
      __return_storage_ptr__->size = uVar7;
      pcVar2[uVar7] = '\0';
      goto LAB_001033c1;
    }
    str = &local_50;
  }
  else {
    if (local_50.size < 2) {
      cVar4 = '\0';
    }
    else {
      cVar4 = mctools_drive_letter(&local_50);
    }
    if (uVar7 == 1) {
      cVar5 = '\0';
    }
    else {
      cVar5 = mctools_drive_letter(&local_68);
    }
    if ((uVar9 == 0) || (iVar6 = mctools_path_is_absolute(&local_68), iVar6 != 0)) {
      str = &local_68;
      if (cVar5 == '\0' && cVar4 != '\0') {
        mcu8str_create(__return_storage_ptr__,(ulong)(uVar7 + 2));
        pcVar2 = __return_storage_ptr__->c_str;
        *pcVar2 = cVar4;
        pcVar2[1] = ':';
        pcVar2[2] = '\0';
        __return_storage_ptr__->size = 2;
        mcu8str_append(__return_storage_ptr__,&local_68);
        goto LAB_001033c1;
      }
    }
    else if (cVar4 == cVar5 || cVar5 == '\0') {
      uVar1 = (ulong)(cVar4 != '\0') * 2 + 1;
      uVar3 = uVar9;
      lVar8 = 0;
      if (cVar4 != '\0') {
        lVar8 = (ulong)(cVar4 != cVar5) * 2 + -2;
      }
      for (; ((uVar1 < uVar3 &&
              ((uVar9 = uVar3, local_50.c_str[uVar3 - 1] == '\\' ||
               (local_50.c_str[uVar3 - 1] == '/')))) &&
             ((local_50.c_str[uVar3 - 2] == '\\' || (local_50.c_str[uVar3 - 2] == '/'))));
          uVar3 = uVar3 - 1) {
        uVar9 = uVar1;
      }
      local_38 = local_50.c_str;
      cVar4 = local_50.c_str[uVar9 - 1];
      lVar8 = lVar8 + uVar10;
      prealloc_size = (cVar4 != '/' && cVar4 != '\\') + uVar9 + lVar8;
      mcu8str_create(__return_storage_ptr__,prealloc_size);
      pcVar2 = __return_storage_ptr__->c_str;
      memcpy(pcVar2,local_38,uVar9);
      if ((cVar4 != '/') && (cVar4 != '\\')) {
        pcVar2[uVar9] = '/';
        uVar9 = uVar9 + 1;
      }
      memcpy(pcVar2 + uVar9,local_68.c_str,lVar8 + 1);
      __return_storage_ptr__->size = (uint)prealloc_size;
      goto LAB_001033c1;
    }
  }
  mcu8str_copy(__return_storage_ptr__,str);
LAB_001033c1:
  mctools_pathseps_platform(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_path_join( const mcu8str* p1raw, const mcu8str* p2raw )
  {
    //In general try to mimic os.path.path from Python, although we do not
    //require a drive letter on windows to be considered an absolute path, so we
    //might have slight changes in some weird cases.

    mcu8str p1 = mctools_impl_view_no_winnamespace(p1raw);
    mcu8str p2 = mctools_impl_view_no_winnamespace(p2raw);

#ifdef MC_IS_WINDOWS
    const char native_sep = '\\';
#else
    const char native_sep = '/';
#endif

    if ( p2.size == 0 ) {
      //Simply copy p1, but ensure it ends in a separator:
      if ( !p1.size )
        return mcu8str_create_empty();//special case: join("","")->""
      char lastchar = p1.c_str[p1.size-1];
      if ( lastchar == '\\' || lastchar == '/' ) {
        mcu8str p1copy = mcu8str_copy( &p1 );
        mctools_pathseps_platform(&p1copy);
        return p1copy;
      }
      mcu8str res = mcu8str_create( p1.size + 1 );
      mcu8str_append( &res, &p1 );
      res.c_str[res.size] = native_sep;
      ++( res.size );
      res.c_str[res.size] = '\0';
      mctools_pathseps_platform(&res);
      return res;
    }

    char drive_letter1 = p1.size >= 2 ? mctools_drive_letter(&p1) : 0;
    char drive_letter2 = p2.size >= 2 ? mctools_drive_letter(&p2) : 0;
    if ( p1.size == 0 || mctools_path_is_absolute(&p2) ) {
      //p1 is empty or p2 is an absolute path, so simply discard p1 (like
      //Pythons os.path.join does in this case). However, if there is a drive
      //letter in p1 and not in p2, we use that drive letter:
      if ( drive_letter1 && !drive_letter2 ) {
        mcu8str res = mcu8str_create( p2.size + 2 );
        res.c_str[0] = drive_letter1;
        res.c_str[1] = ':';
        res.c_str[2] = '\0';
        res.size = 2;
        mcu8str_append( &res, &p2 );
        mctools_pathseps_platform(&res);
        return res;
      } else {
        mcu8str p2copy = mcu8str_copy( &p2 );
        mctools_pathseps_platform(&p2copy);
        return p2copy;
      }
    }

    if ( drive_letter2 && drive_letter1 != drive_letter2 ) {
      //p2 has a drive letter and p1 has a different drive letter => simply
      //return p2.
      mcu8str p2copy = mcu8str_copy( &p2 );
      mctools_pathseps_platform(&p2copy);
      return p2copy;
    }

    //Neither p1 or p2 are empty here, so we can simply join them. However, if
    //there is a common drive letter or repeated slashes at the end of p1, we do
    //not repeat them needlessley.

    //Selected ranges:
    mcu8str_size_t iB1 = 0;
    mcu8str_size_t iE1 = p1.size;
    mcu8str_size_t iB2 = 0;
    mcu8str_size_t iE2 = p2.size;

    if ( drive_letter1 && drive_letter1 == drive_letter2 )
      iB2 += 2;//skip common drive letter from p2

    //Strip repeated trailing slashes down to one trailing slash:
    mcu8str_size_t minlen1 = ( drive_letter1 ? 3 : 1 );
    while ( iE1-iB1 > minlen1
            && ( p1.c_str[iE1-1]=='/' || p1.c_str[iE1-1]=='\\' )
            && ( p1.c_str[iE1-2]=='/' || p1.c_str[iE1-2]=='\\' ) )
      --iE1;

    mcu8str_size_t needs_slash = ( ( p1.c_str[iE1-1]=='/'
                                   || p1.c_str[iE1-1]=='\\' ) ? 0 : 1 );

    mcu8str_size_t s1 = iE1-iB1;
    mcu8str_size_t s2 = iE2-iB2;
    mcu8str_size_t newsize = s1 + s2 + needs_slash;
    mcu8str res =  mcu8str_create( newsize  );
    STDNS memcpy( res.c_str, p1.c_str, s1 );
    mcu8str_size_t used = s1;
    if ( needs_slash ) {
      res.c_str[used] = native_sep;
      ++used;
    }
    STDNS memcpy( res.c_str + used, p2.c_str, s2+1 );//+1 to include null char
    res.size = (unsigned)newsize;//cast ok due to mcu8str_create
    mctools_pathseps_platform(&res);
    return res;
  }